

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastpack20(uint64_t *in,uint32_t *out)

{
  *out = (uint)*in & 0xfffff;
  Unroller<(unsigned_short)20,_(unsigned_short)1>::Pack(in,out);
  return;
}

Assistant:

void __fastpack20(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<20>::Pack(in, out);
}